

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::NumLayersTest::build(NumLayersTest *this,FboBuilder *builder)

{
  GLenum GVar1;
  GLuint GVar2;
  Texture *in_RAX;
  Texture *texCfg;
  undefined **ppuVar3;
  ImageFormat IVar4;
  Attachment *att;
  Texture *local_28;
  
  GVar1 = (this->super_ParamTest<deqp::gles3::Functional::NumLayersParams>).m_params.textureKind;
  if (GVar1 == 0x8c1a) {
    texCfg = (Texture *)operator_new(0x20);
    (texCfg->super_Image).width = 0;
    (texCfg->super_Image).height = 0;
    *(undefined8 *)&texCfg->numLevels = 0;
    (texCfg->super_Image).super_Config._vptr_Config = (_func_int **)0x0;
    (texCfg->super_Image).internalFormat.format = 0;
    (texCfg->super_Image).internalFormat.unsizedType = 0;
    *(undefined8 *)&texCfg->numLevels = 0x100000001;
    ppuVar3 = &PTR__Config_00d10570;
  }
  else {
    if (GVar1 != 0x806f) {
      texCfg = (Texture *)0x0;
      local_28 = in_RAX;
      goto LAB_00688a7e;
    }
    texCfg = (Texture *)operator_new(0x20);
    (texCfg->super_Image).width = 0;
    (texCfg->super_Image).height = 0;
    *(undefined8 *)&texCfg->numLevels = 0;
    (texCfg->super_Image).super_Config._vptr_Config = (_func_int **)0x0;
    (texCfg->super_Image).internalFormat.format = 0;
    (texCfg->super_Image).internalFormat.unsizedType = 0;
    *(undefined8 *)&texCfg->numLevels = 0x100000001;
    ppuVar3 = &PTR__Config_00d104e0;
  }
  (texCfg->super_Image).super_Config._vptr_Config = (_func_int **)ppuVar3;
  local_28 = texCfg;
  std::
  _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
  ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
            ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
              *)&builder->m_configs,(Config **)&local_28);
LAB_00688a7e:
  IVar4 = deqp::gls::fboc::details::TestBase::getDefaultFormat((TestBase *)this,0x8ce0,0x1702);
  (texCfg->super_Image).internalFormat = IVar4;
  (texCfg->super_Image).width = 0x40;
  (texCfg->super_Image).height = 0x40;
  *(GLsizei *)&texCfg->field_0x1c =
       (this->super_ParamTest<deqp::gles3::Functional::NumLayersParams>).m_params.numLayers;
  GVar2 = deqp::gls::FboUtil::FboBuilder::glCreateTexture(builder,texCfg);
  att = (Attachment *)
        deqp::gls::FboUtil::FboBuilder::
        makeConfig<deqp::gls::FboUtil::config::TextureLayerAttachment>(builder);
  *(GLsizei *)((long)&att[1].super_Config._vptr_Config + 4) =
       (this->super_ParamTest<deqp::gles3::Functional::NumLayersParams>).m_params.attachmentLayer;
  att->imageName = GVar2;
  deqp::gls::FboUtil::FboBuilder::glAttach(builder,0x8ce0,att);
  return STOP;
}

Assistant:

IterateResult NumLayersTest::build (FboBuilder& builder)
{
	TextureLayered* texCfg = DE_NULL;
	const GLenum target = GL_COLOR_ATTACHMENT0;

	switch (m_params.textureKind)
	{
		case GL_TEXTURE_3D:
			texCfg = &builder.makeConfig<Texture3D>();
			break;
		case GL_TEXTURE_2D_ARRAY:
			texCfg = &builder.makeConfig<Texture2DArray>();
			break;
		default:
			DE_FATAL("Impossible case");
	}
	texCfg->internalFormat = getDefaultFormat(target, GL_TEXTURE);
	texCfg->width = 64;
	texCfg->height = 64;
	texCfg->numLayers = m_params.numLayers;
	const GLuint tex = builder.glCreateTexture(*texCfg);

	TextureLayerAttachment* att = &builder.makeConfig<TextureLayerAttachment>();
	att->layer = m_params.attachmentLayer;
	att->imageName = tex;

	builder.glAttach(target, att);

	return STOP;
}